

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O1

int Ver_ParseConstant(Ver_Man_t *pMan,char *pWord)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  void **ppvVar4;
  void *pvVar5;
  ulong uVar6;
  Vec_Ptr_t *pVVar7;
  char *pcVar8;
  int iVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  
  if ((*pWord < '1') || ('9' < pWord[1])) {
    __assert_fail("pWord[0] >= \'1\' && pWord[1] <= \'9\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                  ,0x2f4,"int Ver_ParseConstant(Ver_Man_t *, char *)");
  }
  uVar3 = atoi(pWord);
  do {
    pcVar8 = pWord;
    if (*pcVar8 == '\0') {
      builtin_strncpy(pMan->sError,"Cannot find symbol \' in the constant.",0x26);
      goto LAB_002eb297;
    }
    pWord = pcVar8 + 1;
  } while (*pcVar8 != '\'');
  if (pcVar8[1] == 'b') {
    pMan->vNames->nSize = 0;
    iVar9 = 1;
    if (0 < (int)uVar3) {
      uVar6 = 0;
      do {
        bVar1 = pcVar8[uVar6 + 2];
        if (bVar1 - 0x30 < 2) {
          pVVar7 = pMan->vNames;
          pvVar5 = (void *)((long)(char)bVar1 + -0x30);
          uVar2 = pVVar7->nCap;
          if (pVVar7->nSize == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar7->pArray,0x80);
              }
              pVVar7->pArray = ppvVar4;
              iVar9 = 0x10;
            }
            else {
              iVar9 = uVar2 * 2;
              if (iVar9 <= (int)uVar2) goto LAB_002eb22a;
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar7->pArray,(ulong)uVar2 << 4);
              }
              pVVar7->pArray = ppvVar4;
            }
            pVVar7->nCap = iVar9;
          }
        }
        else {
          if (bVar1 != 0x78) {
            builtin_strncpy(pMan->sError + 0x10,"arsing the binary constant.",0x1c);
            uVar10._0_1_ = 'H';
            uVar10._1_1_ = 'a';
            uVar10._2_1_ = 'v';
            uVar10._3_1_ = 'i';
            uVar11._0_1_ = 'n';
            uVar11._1_1_ = 'g';
            uVar11._2_1_ = ' ';
            uVar11._3_1_ = 'p';
            uVar12._0_1_ = 'r';
            uVar12._1_1_ = 'o';
            uVar12._2_1_ = 'b';
            uVar12._3_1_ = 'l';
            uVar13._0_1_ = 'e';
            uVar13._1_1_ = 'm';
            uVar13._2_1_ = ' ';
            uVar13._3_1_ = 'p';
            goto LAB_002eb293;
          }
          pVVar7 = pMan->vNames;
          uVar2 = pVVar7->nCap;
          if (pVVar7->nSize == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar7->pArray,0x80);
              }
              pVVar7->pArray = ppvVar4;
              iVar9 = 0x10;
            }
            else {
              iVar9 = uVar2 * 2;
              if (iVar9 <= (int)uVar2) goto LAB_002eb228;
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar7->pArray,(ulong)uVar2 << 4);
              }
              pVVar7->pArray = ppvVar4;
            }
            pVVar7->nCap = iVar9;
          }
LAB_002eb228:
          pvVar5 = (void *)0x0;
        }
LAB_002eb22a:
        iVar9 = pVVar7->nSize;
        pVVar7->nSize = iVar9 + 1;
        pVVar7->pArray[iVar9] = pvVar5;
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
      iVar9 = 1;
    }
  }
  else {
    builtin_strncpy(pMan->sError + 0x10,"ly handle binary constants.",0x1c);
    uVar10._0_1_ = 'C';
    uVar10._1_1_ = 'u';
    uVar10._2_1_ = 'r';
    uVar10._3_1_ = 'r';
    uVar11._0_1_ = 'e';
    uVar11._1_1_ = 'n';
    uVar11._2_1_ = 't';
    uVar11._3_1_ = 'l';
    uVar12._0_1_ = 'y';
    uVar12._1_1_ = ' ';
    uVar12._2_1_ = 'c';
    uVar12._3_1_ = 'a';
    uVar13._0_1_ = 'n';
    uVar13._1_1_ = ' ';
    uVar13._2_1_ = 'o';
    uVar13._3_1_ = 'n';
LAB_002eb293:
    *(undefined4 *)pMan->sError = uVar10;
    *(undefined4 *)(pMan->sError + 4) = uVar11;
    *(undefined4 *)(pMan->sError + 8) = uVar12;
    *(undefined4 *)(pMan->sError + 0xc) = uVar13;
LAB_002eb297:
    Ver_ParsePrintErrorMessage(pMan);
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int Ver_ParseConstant( Ver_Man_t * pMan, char * pWord )
{
    int nBits, i;
    assert( pWord[0] >= '1' && pWord[1] <= '9' );
    nBits = atoi(pWord);
    // find the next symbol \'
    while ( *pWord && *pWord != '\'' )
        pWord++;
    if ( *pWord == 0 )
    {
        sprintf( pMan->sError, "Cannot find symbol \' in the constant." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    assert( *pWord == '\'' );
    pWord++;
    if ( *pWord != 'b' )
    {
        sprintf( pMan->sError, "Currently can only handle binary constants." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    pWord++;
    // scan the bits
    Vec_PtrClear( pMan->vNames );
    for ( i = 0; i < nBits; i++ )
    {
      if ( pWord[i] != '0' && pWord[i] != '1' && pWord[i] != 'x' )
      {
         sprintf( pMan->sError, "Having problem parsing the binary constant." );
         Ver_ParsePrintErrorMessage( pMan );
         return 0;
      }
      if ( pWord[i] == 'x' ) 
          Vec_PtrPush( pMan->vNames, (void *)0 );
      else 
          Vec_PtrPush( pMan->vNames, (void *)(ABC_PTRUINT_T)(pWord[i]-'0') );
    }
    return 1;
}